

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::
holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::to_string
          (string *__return_storage_ptr__,
          holder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->mDat)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->mDat)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}